

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall DSBarInfo::ScreenSizeChanged(DSBarInfo *this)

{
  SBarInfo *pSVar1;
  int iVar2;
  
  DBaseStatusBar::ScreenSizeChanged(&this->super_DBaseStatusBar);
  iVar2 = uiscale.Value;
  pSVar1 = this->script;
  if (uiscale.Value < 1) {
    V_CalcCleanFacs(pSVar1->resW,pSVar1->resH,(screen->super_DSimpleCanvas).super_DCanvas.Width,
                    (screen->super_DSimpleCanvas).super_DCanvas.Height,&pSVar1->cleanX,
                    &pSVar1->cleanY,(int *)0x0,(int *)0x0);
  }
  else {
    pSVar1->cleanX = uiscale.Value;
    pSVar1->cleanY = iVar2;
  }
  return;
}

Assistant:

void ScreenSizeChanged()
	{
		Super::ScreenSizeChanged();
		if (uiscale > 0)
		{
			script->cleanX = uiscale;
			script->cleanY = uiscale;
		}
		else
		{
			V_CalcCleanFacs(script->resW, script->resH, SCREENWIDTH, SCREENHEIGHT, &script->cleanX, &script->cleanY);
		}
	}